

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utp_socket_manager.cpp
# Opt level: O0

void __thiscall
libtorrent::aux::utp_socket_manager::utp_socket_manager
          (utp_socket_manager *this,send_fun_t *send_fun,incoming_utp_callback_t *cb,io_context *ios
          ,session_settings *sett,counters *cnt,void *ssl_context)

{
  value_type_conflict2 local_48 [4];
  counters *local_38;
  counters *cnt_local;
  session_settings *sett_local;
  io_context *ios_local;
  incoming_utp_callback_t *cb_local;
  send_fun_t *send_fun_local;
  utp_socket_manager *this_local;
  
  local_38 = cnt;
  cnt_local = (counters *)sett;
  sett_local = (session_settings *)ios;
  ios_local = (io_context *)cb;
  cb_local = (incoming_utp_callback_t *)send_fun;
  send_fun_local = &this->m_send_fun;
  ::std::
  function<void_(std::weak_ptr<libtorrent::aux::utp_socket_interface>,_const_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_&,_libtorrent::span<const_char>,_boost::system::error_code_&,_libtorrent::flags::bitfield_flag<unsigned_char,_libtorrent::aux::udp_send_flags_tag,_void>)>
  ::function(&this->m_send_fun,send_fun);
  ::std::
  function<void_(libtorrent::aux::polymorphic_socket<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>,_libtorrent::socks5_stream,_libtorrent::aux::http_stream,_libtorrent::aux::utp_stream,_libtorrent::i2p_stream,_libtorrent::aux::ssl_stream<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>_>,_libtorrent::aux::ssl_stream<libtorrent::socks5_stream>,_libtorrent::aux::ssl_stream<libtorrent::aux::http_stream>,_libtorrent::aux::ssl_stream<libtorrent::aux::utp_stream>_>)>
  ::function(&this->m_cb,cb);
  ::std::
  multimap<unsigned_short,_std::unique_ptr<libtorrent::aux::utp_socket_impl,_std::default_delete<libtorrent::aux::utp_socket_impl>_>,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_std::unique_ptr<libtorrent::aux::utp_socket_impl,_std::default_delete<libtorrent::aux::utp_socket_impl>_>_>_>_>
  ::multimap(&this->m_utp_sockets);
  this->m_deferred_ack = (utp_socket_impl *)0x0;
  ::std::
  vector<libtorrent::aux::utp_socket_impl_*,_std::allocator<libtorrent::aux::utp_socket_impl_*>_>::
  vector(&this->m_temp_sockets);
  ::std::
  vector<libtorrent::aux::utp_socket_impl_*,_std::allocator<libtorrent::aux::utp_socket_impl_*>_>::
  vector(&this->m_drained_event);
  ::std::
  vector<libtorrent::aux::utp_socket_impl_*,_std::allocator<libtorrent::aux::utp_socket_impl_*>_>::
  vector(&this->m_stalled_sockets);
  this->m_last_socket = (utp_socket_impl *)0x0;
  this->m_new_connection = -1;
  this->m_sett = (session_settings *)cnt_local;
  this->m_counters = local_38;
  this->m_ios = (io_context *)sett_local;
  this->m_mtu_idx = 0;
  this->m_ssl_context = ssl_context;
  packet_pool::packet_pool(&this->m_packet_pool);
  local_48[0] = 0x10000;
  ::std::array<int,_3UL>::fill(&this->m_restrict_mtu,local_48);
  return;
}

Assistant:

utp_socket_manager::utp_socket_manager(
		send_fun_t send_fun
		, incoming_utp_callback_t cb
		, io_context& ios
		, aux::session_settings const& sett
		, counters& cnt
		, void* ssl_context)
		: m_send_fun(std::move(send_fun))
		, m_cb(std::move(cb))
		, m_sett(sett)
		, m_counters(cnt)
		, m_ios(ios)
		, m_ssl_context(ssl_context)
	{
		m_restrict_mtu.fill(65536);
	}